

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiSphereShape.cpp
# Opt level: O0

void __thiscall
btMultiSphereShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btMultiSphereShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  btVector3 *pbVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  btVector3 bVar5;
  long i;
  long i_1;
  int inner_count;
  btVector3 temp [128];
  int k;
  int numSpheres;
  btScalar *rad;
  btVector3 *pos;
  btScalar newDot;
  btVector3 vtx;
  btVector3 *vec;
  btScalar maxDot;
  int j;
  btVector3 *in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff700;
  int iVar6;
  btVector3 *this_00;
  btVector3 *local_8e8;
  undefined8 local_888;
  undefined8 local_880;
  long local_878;
  btVector3 local_868 [128];
  btVector3 bStack_68;
  float *local_58;
  btVector3 *local_50;
  float local_44;
  btVector3 local_40;
  btVector3 *local_30;
  float local_24;
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    local_24 = -1e+18;
    local_30 = (btVector3 *)(local_10 + (long)local_20 * 0x10);
    btVector3::btVector3(&local_40);
    local_50 = btAlignedObjectArray<btVector3>::operator[]
                         ((btAlignedObjectArray<btVector3> *)(in_RDI + 0xd),0);
    local_58 = btAlignedObjectArray<float>::operator[]
                         ((btAlignedObjectArray<float> *)(in_RDI + 0x11),0);
    bStack_68.m_floats[3] =
         (btScalar)
         btAlignedObjectArray<btVector3>::size((btAlignedObjectArray<btVector3> *)(in_RDI + 0xd));
    for (bStack_68.m_floats[2] = 0.0; (int)bStack_68.m_floats[2] < (int)bStack_68.m_floats[3];
        bStack_68.m_floats[2] = (btScalar)((int)bStack_68.m_floats[2] + 0x80)) {
      this_00 = &bStack_68;
      pbVar1 = local_868;
      do {
        local_8e8 = pbVar1;
        btVector3::btVector3(local_8e8);
        pbVar1 = local_8e8 + 1;
      } while (local_8e8 + 1 != this_00);
      if ((int)bStack_68.m_floats[3] - (int)bStack_68.m_floats[2] < 0x80) {
        iVar2 = (int)bStack_68.m_floats[3] - (int)bStack_68.m_floats[2];
      }
      else {
        iVar2 = 0x80;
      }
      iVar6 = iVar2;
      for (local_878 = 0; local_878 < iVar2; local_878 = local_878 + 1) {
        ::operator*((btVector3 *)CONCAT44(iVar6,in_stack_fffffffffffff700),in_stack_fffffffffffff6f8
                   );
        ::operator*((btVector3 *)CONCAT44(iVar6,in_stack_fffffffffffff700),
                    in_stack_fffffffffffff6f8->m_floats);
        operator+((btVector3 *)CONCAT44(iVar6,in_stack_fffffffffffff700),in_stack_fffffffffffff6f8);
        in_stack_fffffffffffff6f8 = local_30;
        (**(code **)(*in_RDI + 0x60))();
        ::operator*((btVector3 *)CONCAT44(iVar6,in_stack_fffffffffffff700),
                    in_stack_fffffffffffff6f8->m_floats);
        bVar5 = operator-((btVector3 *)CONCAT44(iVar6,in_stack_fffffffffffff700),
                          in_stack_fffffffffffff6f8);
        local_888 = bVar5.m_floats._0_8_;
        *(undefined8 *)local_868[local_878].m_floats = local_888;
        local_880 = bVar5.m_floats._8_8_;
        *(undefined8 *)(local_868[local_878].m_floats + 2) = local_880;
        local_50 = local_50 + 1;
        local_58 = local_58 + 1;
      }
      lVar3 = btVector3::maxDot(this_00,local_8e8,CONCAT44(iVar6,in_stack_fffffffffffff700),
                                in_stack_fffffffffffff6f8->m_floats);
      if (local_24 < local_44) {
        local_24 = local_44;
        puVar4 = (undefined8 *)(local_18 + (long)local_20 * 0x10);
        *puVar4 = *(undefined8 *)local_868[lVar3].m_floats;
        puVar4[1] = *(undefined8 *)(local_868[lVar3].m_floats + 2);
      }
    }
  }
  return;
}

Assistant:

void	btMultiSphereShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{

	for (int j=0;j<numVectors;j++)
	{
		btScalar maxDot(btScalar(-BT_LARGE_FLOAT));

		const btVector3& vec = vectors[j];

		btVector3 vtx;
		btScalar newDot;

		const btVector3* pos = &m_localPositionArray[0];
		const btScalar* rad = &m_radiArray[0];
		int numSpheres = m_localPositionArray.size();

        for( int k = 0; k < numSpheres; k+= 128 )
        {
            btVector3 temp[128];
            int inner_count = MIN( numSpheres - k, 128 );
            for( long i = 0; i < inner_count; i++ )
            {
                temp[i] = (*pos) +vec*m_localScaling*(*rad) - vec * getMargin();
                pos++;
                rad++;
            }
            long i = vec.maxDot( temp, inner_count, newDot);
            if( newDot > maxDot )
            {
                maxDot = newDot;
                supportVerticesOut[j] = temp[i];
            }
        }
        
	}
}